

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

bool __thiscall mat_lib::matrix<double>::operator==(matrix<double> *this,matrix<double> *m)

{
  double *pdVar1;
  double dVar2;
  size_t sVar3;
  size_t j;
  size_t sVar4;
  element_t *peVar5;
  size_t sVar6;
  long lVar7;
  
  if ((this->rows__ != m->rows__) || (sVar3 = this->columns__, sVar3 != m->columns__)) {
    return false;
  }
  peVar5 = m->elements__;
  sVar6 = 0;
  do {
    if (sVar6 == this->rows__) {
      return true;
    }
    lVar7 = 0;
    sVar4 = 0;
    while (sVar3 != sVar4) {
      dVar2 = *(double *)((long)this->elements__ + (lVar7 >> 0x1d) + sVar6 * sVar3 * 8);
      lVar7 = lVar7 + 0x100000000;
      pdVar1 = peVar5 + sVar4;
      sVar4 = sVar4 + 1;
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        return false;
      }
    }
    sVar6 = sVar6 + 1;
    peVar5 = peVar5 + sVar3;
  } while( true );
}

Assistant:

bool matrix<T>::operator==(const matrix<T>& m) const
  {
    if((rows__!=m.rows()) || (columns__!=m.columns())) return false; 

    for(size_t i=0; i<rows__; i++)
      for(size_t j=0; j<columns__; j++) 
        if(elements__[offset__(i,j)]!=m[i][j]) return false;
    
    return true;
  }